

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

void to_top_objects_proc(Am_Object *cmd)

{
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Am_Object(&local_20,cmd);
  Am_Value::Am_Value(&local_18,&Am_No_Value);
  do_to_top_or_bottom(&local_20,true,&local_18);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, to_top_objects, (Am_Object cmd))
{
  do_to_top_or_bottom(cmd, true);
}